

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

void __thiscall
duckdb::StreamingWindowState::Initialize
          (StreamingWindowState *this,ClientContext *context,DataChunk *input,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *expressions)

{
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
  *this_00;
  DataChunk *this_01;
  ExpressionType EVar1;
  long lVar2;
  ulong uVar3;
  ClientContext *context_00;
  StreamingWindowState *pSVar4;
  DataChunk *this_02;
  pointer ppEVar5;
  pointer __p;
  pointer __p_00;
  const_reference this_03;
  type pEVar6;
  BoundWindowExpression *args_1;
  __uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
  *this_04;
  reference this_05;
  pointer pLVar7;
  ulong uVar8;
  __uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
  *this_06;
  reference pvVar9;
  Allocator *allocator;
  pointer pEVar10;
  __uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *p_Var11;
  ulong __n;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_141;
  ClientContext *local_140;
  StreamingWindowState *local_138;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_130;
  DataChunk *local_128;
  ExpressionExecutor executor;
  DataChunk result;
  pointer local_88 [3];
  Value local_70;
  
  local_130 = &this->const_vectors;
  local_140 = context;
  local_128 = input;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ::resize(&local_130->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  ::std::
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  ::resize(&(this->aggregate_states).
            super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  this_00 = &this->lead_lag_states;
  local_138 = this;
  ::std::
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  ::resize(&this_00->
            super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  __n = 0;
  do {
    this_02 = local_128;
    pSVar4 = local_138;
    if ((ulong)((long)(expressions->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(expressions->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      if (local_138->lead_count != 0) {
        this_01 = &local_138->delayed;
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&executor,local_128);
        context_00 = local_140;
        DataChunk::Initialize
                  (this_01,local_140,(vector<duckdb::LogicalType,_true> *)&executor,
                   pSVar4->lead_count + 0x800);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&executor);
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&executor,this_02);
        DataChunk::Initialize
                  (&pSVar4->shifted,context_00,(vector<duckdb::LogicalType,_true> *)&executor,
                   pSVar4->lead_count + 0x800);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&executor);
      }
      pSVar4->initialized = true;
      return;
    }
    this_03 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(expressions,__n);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(this_03);
    args_1 = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar6->super_BaseExpression);
    EVar1 = (pEVar6->super_BaseExpression).type;
    switch(EVar1) {
    case WINDOW_RANK:
    case WINDOW_RANK_DENSE:
      Value::Value((Value *)&executor,1);
      make_uniq<duckdb::Vector,duckdb::Value>((duckdb *)&result,(Value *)&executor);
      p_Var11 = (__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
                vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::get<true>(local_130,__n);
      goto LAB_01889689;
    case WINDOW_NTILE:
    case WINDOW_CUME_DIST:
    case WINDOW_ROW_NUMBER:
    case 0x7e:
    case 0x7f:
    case 0x80:
    case 0x81:
    case WINDOW_LAST_VALUE:
      break;
    case WINDOW_PERCENT_RANK:
      Value::Value((Value *)&executor,0.0);
      make_uniq<duckdb::Vector,duckdb::Value>((duckdb *)&result,(Value *)&executor);
      p_Var11 = (__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
                vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::get<true>(local_130,__n);
LAB_01889689:
      __p = result.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start;
      result.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
                (p_Var11,__p);
      ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&result);
      Value::~Value((Value *)&executor);
      break;
    case WINDOW_FIRST_VALUE:
      ExpressionExecutor::ExpressionExecutor(&executor,local_140);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&args_1->children,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar9);
      ExpressionExecutor::AddExpression(&executor,pEVar6);
      DataChunk::DataChunk(&result);
      allocator = Allocator::Get(local_140);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&args_1->children,0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar9);
      LogicalType::LogicalType((LogicalType *)local_88,&pEVar10->return_type);
      __l._M_len = 1;
      __l._M_array = (LogicalType *)local_88;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70,__l,
                 &local_141);
      DataChunk::Initialize(&result,allocator,(vector<duckdb::LogicalType,_true> *)&local_70,0x800);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70);
      LogicalType::~LogicalType((LogicalType *)local_88);
      ExpressionExecutor::Execute(&executor,local_128,&result);
      DataChunk::GetValue(&local_70,&result,0,0);
      make_uniq<duckdb::Vector,duckdb::Value>((duckdb *)local_88,&local_70);
      p_Var11 = (__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
                vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::get<true>(local_130,__n);
      __p_00 = local_88[0];
      local_88[0] = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
                (p_Var11,__p_00);
      ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)local_88);
      Value::~Value(&local_70);
      DataChunk::~DataChunk(&result);
      ExpressionExecutor::~ExpressionExecutor(&executor);
      break;
    case WINDOW_LEAD:
    case WINDOW_LAG:
      make_uniq<duckdb::StreamingWindowState::LeadLagState,duckdb::ClientContext&,duckdb::BoundWindowExpression&>
                ((duckdb *)&executor,local_140,args_1);
      this_04 = (__uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
                 *)vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                   ::get<true>(this_00,__n);
      ppEVar5 = executor.expressions.
                super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                .
                super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      executor.expressions.
      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
      ::reset(this_04,(pointer)ppEVar5);
      ::std::
      unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
      ::~unique_ptr((unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
                     *)&executor);
      this_05 = vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                ::get<true>(this_00,__n);
      pLVar7 = unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
               ::operator->(this_05);
      lVar2 = pLVar7->offset;
      if (lVar2 < 0) {
        uVar3 = local_138->lead_count;
        uVar8 = -lVar2;
        if ((ulong)-lVar2 < uVar3 || -uVar3 == lVar2) {
          uVar8 = uVar3;
        }
        local_138->lead_count = uVar8;
      }
      break;
    default:
      if (EVar1 == WINDOW_AGGREGATE) {
        make_uniq<duckdb::StreamingWindowState::AggregateState,duckdb::ClientContext&,duckdb::BoundWindowExpression&,duckdb::Allocator&>
                  ((duckdb *)&executor,local_140,args_1,local_138->allocator);
        this_06 = (__uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
                   *)vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
                     ::get<true>(&this->aggregate_states,__n);
        ppEVar5 = executor.expressions.
                  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                  .
                  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        executor.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ::std::
        __uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
        ::reset(this_06,(pointer)ppEVar5);
        ::std::
        unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
        ::~unique_ptr((unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
                       *)&executor);
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void Initialize(ClientContext &context, DataChunk &input, const vector<unique_ptr<Expression>> &expressions) {
		const_vectors.resize(expressions.size());
		aggregate_states.resize(expressions.size());
		lead_lag_states.resize(expressions.size());

		for (idx_t expr_idx = 0; expr_idx < expressions.size(); expr_idx++) {
			auto &expr = *expressions[expr_idx];
			auto &wexpr = expr.Cast<BoundWindowExpression>();
			switch (expr.GetExpressionType()) {
			case ExpressionType::WINDOW_AGGREGATE:
				aggregate_states[expr_idx] = make_uniq<AggregateState>(context, wexpr, allocator);
				break;
			case ExpressionType::WINDOW_FIRST_VALUE: {
				// Just execute the expression once
				ExpressionExecutor executor(context);
				executor.AddExpression(*wexpr.children[0]);
				DataChunk result;
				result.Initialize(Allocator::Get(context), {wexpr.children[0]->return_type});
				executor.Execute(input, result);

				const_vectors[expr_idx] = make_uniq<Vector>(result.GetValue(0, 0));
				break;
			}
			case ExpressionType::WINDOW_PERCENT_RANK: {
				const_vectors[expr_idx] = make_uniq<Vector>(Value((double)0));
				break;
			}
			case ExpressionType::WINDOW_RANK:
			case ExpressionType::WINDOW_RANK_DENSE: {
				const_vectors[expr_idx] = make_uniq<Vector>(Value((int64_t)1));
				break;
			}
			case ExpressionType::WINDOW_LAG:
			case ExpressionType::WINDOW_LEAD: {
				lead_lag_states[expr_idx] = make_uniq<LeadLagState>(context, wexpr);
				const auto offset = lead_lag_states[expr_idx]->offset;
				if (offset < 0) {
					lead_count = MaxValue<idx_t>(idx_t(-offset), lead_count);
				}
				break;
			}
			default:
				break;
			}
		}
		if (lead_count) {
			delayed.Initialize(context, input.GetTypes(), lead_count + STANDARD_VECTOR_SIZE);
			shifted.Initialize(context, input.GetTypes(), lead_count + STANDARD_VECTOR_SIZE);
		}
		initialized = true;
	}